

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcowptr.h
# Opt level: O0

ssize_t __thiscall
vcow_ptr<VRle::Data>::write(vcow_ptr<VRle::Data> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  void *__buf_00;
  vcow_ptr<VRle::Data> *unaff_retaddr;
  vcow_ptr<VRle::Data> *in_stack_fffffffffffffff0;
  Data *args;
  
  args = (Data *)this;
  bVar1 = unique((vcow_ptr<VRle::Data> *)0x124d17);
  if (!bVar1) {
    read(this,__fd,__buf_00,__n);
    vcow_ptr<VRle::Data_const&>(unaff_retaddr,args);
    operator=(unaff_retaddr,(vcow_ptr<VRle::Data> *)args);
    ~vcow_ptr(in_stack_fffffffffffffff0);
  }
  return (ssize_t)&this->mModel->mValue;
}

Assistant:

auto write() -> element_type&
    {
        if (!unique()) *this = vcow_ptr(read());

        return mModel->mValue;
    }